

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O2

bool __thiscall
trento::NucleonCommon::participate(NucleonCommon *this,NucleonData *A,NucleonData *B)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer pCVar3;
  pointer pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  pointer pCVar8;
  Constituent *qA;
  pointer pCVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  double local_40;
  
  if (((A->is_participant_ != true) || (B->is_participant_ != true)) ||
     (bVar7 = true, this->calc_ncoll_ == true)) {
    auVar5._0_8_ = A->x_;
    auVar5._8_8_ = A->y_;
    auVar10._0_8_ = B->x_;
    auVar10._8_8_ = B->y_;
    auVar5 = vsubpd_avx(auVar5,auVar10);
    if (auVar5._0_8_ * auVar5._0_8_ + auVar5._8_8_ * auVar5._8_8_ <= this->max_impact_sq_) {
      sample_constituent_positions(this,A);
      sample_constituent_positions(this,B);
      pCVar9 = (A->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar3 = (A->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_40 = 0.0;
      for (; pCVar9 != pCVar3; pCVar9 = pCVar9 + 1) {
        pCVar4 = (B->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar8 = (B->constituents_).
                      super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                      ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar4;
            pCVar8 = pCVar8 + 1) {
          auVar1._0_8_ = pCVar9->x;
          auVar1._8_8_ = pCVar9->y;
          auVar2._0_8_ = pCVar8->x;
          auVar2._8_8_ = pCVar8->y;
          auVar5 = vsubpd_avx(auVar1,auVar2);
          dVar11 = exp(((auVar5._0_8_ * auVar5._0_8_ + auVar5._8_8_ * auVar5._8_8_) * -0.25) /
                       this->constituent_width_sq_);
          local_40 = local_40 + dVar11;
          in_ZMM1 = ZEXT864((ulong)local_40);
        }
      }
      auVar13._8_8_ = 0;
      auVar13._0_8_ = this->sigma_partonic_;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar10 = vxorpd_avx512vl(auVar13,auVar6);
      auVar5 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->constituent_number_);
      dVar11 = exp(((auVar10._0_8_ * this->prefactor_) / (auVar5._0_8_ + auVar5._0_8_)) * local_40);
      dVar12 = random::canonical<double>();
      if (dVar11 < dVar12) {
        if (A->is_participant_ == false) {
          A->is_participant_ = true;
        }
        if (B->is_participant_ != false) {
          return true;
        }
        B->is_participant_ = true;
        return true;
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

inline bool NucleonCommon::participate(NucleonData& A, NucleonData& B) const {
  // If both nucleons are already participants, there's nothing to do.
  if (A.is_participant() && B.is_participant() && !calc_ncoll_)
    return true;

  auto distance_sq = sqr(A.x() - B.x()) + sqr(A.y() - B.y());

  // Check if nucleons are out of range.
  if (distance_sq > max_impact_sq_)
    return false;

  sample_constituent_positions(A);
  sample_constituent_positions(B);

  auto overlap = 0.;
  for (const auto& qA : A.constituents_) {
    for (const auto& qB : B.constituents_) {
      auto distance_sq = sqr(qA.x - qB.x) + sqr(qA.y - qB.y);
      overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
    }
  }

  // The probability is
  //   P = 1 - exp(...)
  // which we could sample as
  //   P > U
  // where U is a standard uniform (0, 1) random number.  We can also compute
  //   1 - P = exp(...)
  // and then sample
  //   (1 - P) > (1 - U)
  // or equivalently
  //   (1 - P) < U
  auto one_minus_prob = std::exp(
      -sigma_partonic_ * prefactor_/(2.*constituent_number_) * overlap
      );

  // Sample one random number and decide if this pair participates.
  if (one_minus_prob < random::canonical<double>()) {
    set_participant(A);
    set_participant(B);
    return true;
  }

  return false;
}